

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_size_tests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b9e812::AV1ResolutionChange_InvalidRefSize_Test::TestBody
          (AV1ResolutionChange_InvalidRefSize_Test *this)

{
  bool bVar1;
  aom_codec_err_t aVar2;
  pointer ctx_00;
  aom_codec_cx_pkt_t *paVar3;
  AssertHelper *this_00;
  long in_RDI;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  int i;
  aom_codec_cx_pkt_t *pkt;
  aom_codec_iter_t iter;
  AssertionResult gtest_ar_3;
  value_type *frame_size;
  const_iterator __end1;
  const_iterator __begin1;
  array<FrameSize,_3UL> *__range1;
  int kNumFramesPerResolution;
  RandomVideoSource video;
  size_t frame_count;
  AssertionResult gtest_ar_2;
  unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)> enc;
  AssertionResult gtest_ar_1;
  aom_codec_ctx_t ctx;
  AssertionResult gtest_ar;
  aom_codec_enc_cfg_t cfg;
  aom_codec_iface_t *iface;
  uint in_stack_fffffffffffff998;
  uint in_stack_fffffffffffff99c;
  RandomVideoSource *in_stack_fffffffffffff9a0;
  aom_codec_enc_cfg_t *in_stack_fffffffffffff9a8;
  aom_codec_iface_t *in_stack_fffffffffffff9b0;
  Message *in_stack_fffffffffffff9b8;
  int line;
  aom_codec_enc_cfg_t *in_stack_fffffffffffff9c0;
  aom_image_t *in_stack_fffffffffffff9c8;
  Type TVar4;
  aom_codec_ctx_t *in_stack_fffffffffffff9d0;
  Message *in_stack_fffffffffffffa18;
  Message *message;
  undefined4 in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa24;
  AssertionResult local_580 [2];
  undefined4 local_55c;
  AssertionResult local_558 [2];
  undefined4 local_538;
  aom_codec_err_t local_534;
  AssertionResult local_530;
  int local_51c;
  aom_codec_cx_pkt_t *local_518;
  undefined8 local_510;
  undefined4 local_4f8;
  aom_codec_err_t local_4f4;
  AssertionResult local_4f0;
  const_iterator local_4e0;
  const_iterator local_4d8;
  const_iterator local_4d0;
  array<FrameSize,_3UL> *local_4c8;
  undefined4 local_4bc;
  DummyVideoSource local_4b8;
  long local_480;
  undefined4 local_468;
  aom_codec_err_t local_464;
  AssertionResult local_460;
  code *local_450;
  Message local_448 [4];
  undefined4 local_428;
  aom_codec_err_t local_424;
  AssertionResult local_420 [4];
  uint local_3d4;
  undefined4 local_3b0;
  aom_codec_err_t local_3ac;
  AssertionResult local_3a8;
  uint local_38c;
  uint local_388;
  undefined4 local_364;
  undefined4 local_360;
  undefined4 local_338;
  aom_codec_iface_t *local_10;
  
  local_10 = aom_codec_av1_cx();
  local_3ac = aom_codec_enc_config_default
                        (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,
                         (uint)((ulong)in_stack_fffffffffffff9a0 >> 0x20));
  local_3b0 = 0;
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0,
             &in_stack_fffffffffffff9a8->g_usage,(aom_codec_err_t *)in_stack_fffffffffffff9a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff9d0);
    testing::AssertionResult::failure_message((AssertionResult *)0x87c720);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff9d0,
               (Type)((ulong)in_stack_fffffffffffff9c8 >> 0x20),(char *)in_stack_fffffffffffff9c0,
               (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20),(char *)in_stack_fffffffffffff9b0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
               in_stack_fffffffffffffa18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9a0);
    testing::Message::~Message((Message *)0x87c783);
  }
  local_3d4 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x87c80a);
  if (local_3d4 == 0) {
    local_364 = 0;
    local_360 = 0;
    local_338 = *(undefined4 *)(in_RDI + 0x1c);
    local_424 = aom_codec_enc_init_ver
                          (in_stack_fffffffffffff9d0,(aom_codec_iface_t *)in_stack_fffffffffffff9c8,
                           in_stack_fffffffffffff9c0,(aom_codec_flags_t)in_stack_fffffffffffff9b8,
                           (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20));
    local_428 = 0;
    testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
              ((char *)in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0,
               &in_stack_fffffffffffff9a8->g_usage,(aom_codec_err_t *)in_stack_fffffffffffff9a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_420);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9d0);
      testing::AssertionResult::failure_message((AssertionResult *)0x87c8ee);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff9d0,
                 (Type)((ulong)in_stack_fffffffffffff9c8 >> 0x20),(char *)in_stack_fffffffffffff9c0,
                 (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20),(char *)in_stack_fffffffffffff9b0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                 in_stack_fffffffffffffa18);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9a0);
      testing::Message::~Message((Message *)0x87c951);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x87c9c2);
    local_450 = aom_codec_destroy;
    message = local_448;
    std::unique_ptr<aom_codec_ctx,aom_codec_err_t(*)(aom_codec_ctx*)>::
    unique_ptr<aom_codec_err_t(*)(aom_codec_ctx*),void>
              ((unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)> *)
               in_stack_fffffffffffff9a0,
               (pointer)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998),
               (__enable_if_t<_is_lvalue_reference<aom_codec_err_t_(*)(aom_codec_ctx_*)>::value,_aom_codec_err_t_(*&&)(aom_codec_ctx_*)>
                )0x87c9f6);
    ctx_00 = std::unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)>::get
                       ((unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)> *)
                        in_stack_fffffffffffff9a0);
    aVar2 = aom_codec_control(ctx_00,0xd,(ulong)*(uint *)(in_RDI + 0x20));
    local_468 = 0;
    local_464 = aVar2;
    testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
              ((char *)in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0,
               &in_stack_fffffffffffff9a8->g_usage,(aom_codec_err_t *)in_stack_fffffffffffff9a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_460);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9d0);
      testing::AssertionResult::failure_message((AssertionResult *)0x87cacb);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff9d0,
                 (Type)((ulong)in_stack_fffffffffffff9c8 >> 0x20),(char *)in_stack_fffffffffffff9c0,
                 (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20),(char *)in_stack_fffffffffffff9b0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(aVar2,in_stack_fffffffffffffa20),message);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9a0);
      testing::Message::~Message((Message *)0x87cb28);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x87cb99);
    local_480 = 0;
    libaom_test::ACMRandom::DeterministicSeed();
    libaom_test::RandomVideoSource::RandomVideoSource
              ((RandomVideoSource *)in_stack_fffffffffffff9b0,
               (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
    libaom_test::RandomVideoSource::Begin(in_stack_fffffffffffff9a0);
    local_4bc = 2;
    local_4c8 = &TestBody::kFrameSizes;
    local_4d0 = std::array<FrameSize,_3UL>::begin((array<FrameSize,_3UL> *)0x87cbf0);
    local_4d8 = std::array<FrameSize,_3UL>::end((array<FrameSize,_3UL> *)0x87cc04);
    for (; local_4d0 != local_4d8; local_4d0 = local_4d0 + 1) {
      local_4e0 = local_4d0;
      local_38c = local_4d0->width;
      local_388 = local_4d0->height;
      std::unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)>::get
                ((unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)> *)
                 in_stack_fffffffffffff9a0);
      local_4f4 = aom_codec_enc_config_set
                            ((aom_codec_ctx_t *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8)
      ;
      local_4f8 = 0;
      testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                ((char *)in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0,
                 &in_stack_fffffffffffff9a8->g_usage,(aom_codec_err_t *)in_stack_fffffffffffff9a0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4f0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffff9d0);
        testing::AssertionResult::failure_message((AssertionResult *)0x87cd1a);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffff9d0,
                   (Type)((ulong)in_stack_fffffffffffff9c8 >> 0x20),
                   (char *)in_stack_fffffffffffff9c0,(int)((ulong)in_stack_fffffffffffff9b8 >> 0x20)
                   ,(char *)in_stack_fffffffffffff9b0);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(aVar2,in_stack_fffffffffffffa20),message);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9a0);
        testing::Message::~Message((Message *)0x87cd77);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x87cde8);
      libaom_test::DummyVideoSource::SetSize
                (&in_stack_fffffffffffff9a0->super_DummyVideoSource,in_stack_fffffffffffff99c,
                 in_stack_fffffffffffff998);
      for (local_51c = 0; local_51c < 2; local_51c = local_51c + 1) {
        libaom_test::DummyVideoSource::Next((DummyVideoSource *)0x87ce2b);
        std::unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)>::get
                  ((unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)> *)
                   in_stack_fffffffffffff9a0);
        libaom_test::DummyVideoSource::img(&local_4b8);
        libaom_test::DummyVideoSource::pts(&local_4b8);
        libaom_test::DummyVideoSource::duration(&local_4b8);
        local_534 = aom_codec_encode(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
                                     (aom_codec_pts_t)in_stack_fffffffffffff9c0,
                                     (unsigned_long)in_stack_fffffffffffff9b8,
                                     (aom_enc_frame_flags_t)in_stack_fffffffffffff9b0);
        TVar4 = (Type)((ulong)in_stack_fffffffffffff9c8 >> 0x20);
        local_538 = 0;
        testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                  ((char *)in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0,
                   &in_stack_fffffffffffff9a8->g_usage,(aom_codec_err_t *)in_stack_fffffffffffff9a0)
        ;
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_530);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffff9d0);
          in_stack_fffffffffffff9d0 =
               (aom_codec_ctx_t *)
               testing::AssertionResult::failure_message((AssertionResult *)0x87cf1a);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffff9d0,TVar4,
                     (char *)in_stack_fffffffffffff9c0,
                     (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
                     (char *)in_stack_fffffffffffff9b0);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(aVar2,in_stack_fffffffffffffa20),message);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9a0);
          testing::Message::~Message((Message *)0x87cf77);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x87cfe8);
        local_510 = 0;
        while( true ) {
          std::unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)>::get
                    ((unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)> *)
                     in_stack_fffffffffffff9a0);
          paVar3 = aom_codec_get_cx_data
                             ((aom_codec_ctx_t *)in_stack_fffffffffffff9c0,
                              (aom_codec_iter_t *)in_stack_fffffffffffff9b8);
          local_518 = paVar3;
          if (paVar3 == (aom_codec_cx_pkt_t *)0x0) break;
          local_55c = 0;
          testing::internal::EqHelper::
          Compare<aom_codec_cx_pkt_kind,_aom_codec_cx_pkt_kind,_nullptr>
                    ((char *)in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0,
                     &in_stack_fffffffffffff9a8->g_usage,
                     (aom_codec_cx_pkt_kind *)in_stack_fffffffffffff9a0);
          TVar4 = (Type)((ulong)paVar3 >> 0x20);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_558);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffff9d0);
            in_stack_fffffffffffff9c0 =
                 (aom_codec_enc_cfg_t *)
                 testing::AssertionResult::failure_message((AssertionResult *)0x87d0ad);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffff9d0,TVar4,
                       (char *)in_stack_fffffffffffff9c0,
                       (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
                       (char *)in_stack_fffffffffffff9b0);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT44(aVar2,in_stack_fffffffffffffa20),message);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffff9a0);
            testing::Message::~Message((Message *)0x87d10a);
          }
          local_3d4 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x87d191);
          if (local_3d4 != 0) goto LAB_0087d4f8;
          if ((local_51c == 0) || (*(int *)(in_RDI + 0x18) == 2)) {
            testing::internal::CmpHelperNE<unsigned_int,unsigned_int>
                      ((char *)in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0,
                       &in_stack_fffffffffffff9a8->g_usage,(uint *)in_stack_fffffffffffff9a0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_580);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffff9d0);
              in_stack_fffffffffffff9b8 =
                   testing::Message::operator<<
                             ((Message *)in_stack_fffffffffffff9a0,
                              (char (*) [7])
                              CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
              in_stack_fffffffffffff9b0 =
                   (aom_codec_iface_t *)
                   testing::Message::operator<<
                             ((Message *)in_stack_fffffffffffff9a0,
                              (unsigned_long *)
                              CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
              in_stack_fffffffffffff9a8 =
                   (aom_codec_enc_cfg_t *)
                   testing::AssertionResult::failure_message((AssertionResult *)0x87d285);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffff9d0,TVar4,
                         (char *)in_stack_fffffffffffff9c0,
                         (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
                         (char *)in_stack_fffffffffffff9b0);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)CONCAT44(aVar2,in_stack_fffffffffffffa20),message);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffff9a0);
              testing::Message::~Message((Message *)0x87d2df);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x87d34a);
          }
          local_480 = local_480 + 1;
        }
        in_stack_fffffffffffff9c8 = (aom_image_t *)0x0;
      }
    }
    std::array<FrameSize,_3UL>::size(&TestBody::kFrameSizes);
    TVar4 = (Type)((ulong)in_stack_fffffffffffff9c8 >> 0x20);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((char *)in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0,
               (unsigned_long *)in_stack_fffffffffffff9a8,(unsigned_long *)in_stack_fffffffffffff9a0
              );
    line = (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffa58);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9d0);
      this_00 = (AssertHelper *)
                testing::AssertionResult::failure_message((AssertionResult *)0x87d422);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff9d0,TVar4,(char *)in_stack_fffffffffffff9c0,
                 line,(char *)in_stack_fffffffffffff9b0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(aVar2,in_stack_fffffffffffffa20),message);
      testing::internal::AssertHelper::~AssertHelper(this_00);
      testing::Message::~Message((Message *)0x87d47f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x87d4ed);
    local_3d4 = 0;
LAB_0087d4f8:
    libaom_test::RandomVideoSource::~RandomVideoSource((RandomVideoSource *)0x87d505);
    std::unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)>::~unique_ptr
              ((unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)> *)
               in_stack_fffffffffffff9b0);
  }
  return;
}

Assistant:

TEST_P(AV1ResolutionChange, InvalidRefSize) {
  struct FrameSize {
    unsigned int width;
    unsigned int height;
  };
  static constexpr std::array<FrameSize, 3> kFrameSizes = { {
      { 1768, 200 },
      { 50, 200 },
      { 850, 200 },
  } };

  aom_codec_iface_t *iface = aom_codec_av1_cx();
  aom_codec_enc_cfg_t cfg;
  ASSERT_EQ(aom_codec_enc_config_default(iface, &cfg, usage_), AOM_CODEC_OK);

  // Resolution changes are only permitted with one pass encoding with no lag.
  cfg.g_pass = AOM_RC_ONE_PASS;
  cfg.g_lag_in_frames = 0;
  cfg.rc_end_usage = rc_mode_;

  aom_codec_ctx_t ctx;
  EXPECT_EQ(aom_codec_enc_init(&ctx, iface, &cfg, 0), AOM_CODEC_OK);
  std::unique_ptr<aom_codec_ctx_t, decltype(&aom_codec_destroy)> enc(
      &ctx, &aom_codec_destroy);
  EXPECT_EQ(aom_codec_control(enc.get(), AOME_SET_CPUUSED, cpu_used_),
            AOM_CODEC_OK);

  size_t frame_count = 0;
  ::libaom_test::RandomVideoSource video;
  video.Begin();
  constexpr int kNumFramesPerResolution = 2;
  for (const auto &frame_size : kFrameSizes) {
    cfg.g_w = frame_size.width;
    cfg.g_h = frame_size.height;
    EXPECT_EQ(aom_codec_enc_config_set(enc.get(), &cfg), AOM_CODEC_OK);
    video.SetSize(cfg.g_w, cfg.g_h);

    aom_codec_iter_t iter;
    const aom_codec_cx_pkt_t *pkt;

    for (int i = 0; i < kNumFramesPerResolution; ++i) {
      video.Next();  // SetSize() does not call FillFrame().
      EXPECT_EQ(aom_codec_encode(enc.get(), video.img(), video.pts(),
                                 video.duration(), /*flags=*/0),
                AOM_CODEC_OK);

      iter = nullptr;
      while ((pkt = aom_codec_get_cx_data(enc.get(), &iter)) != nullptr) {
        ASSERT_EQ(pkt->kind, AOM_CODEC_CX_FRAME_PKT);
        // The frame following a resolution change should be a keyframe as the
        // change is too extreme to allow previous references to be used.
        if (i == 0 || usage_ == AOM_USAGE_ALL_INTRA) {
          EXPECT_NE(pkt->data.frame.flags & AOM_FRAME_IS_KEY, 0u)
              << "frame " << frame_count;
        }
        frame_count++;
      }
    }
  }

  EXPECT_EQ(frame_count, kNumFramesPerResolution * kFrameSizes.size());
}